

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

bool __thiscall minja::Value::operator<(Value *this,Value *other)

{
  value_t vVar1;
  double dVar2;
  uint uVar3;
  runtime_error *prVar4;
  long *plVar5;
  size_type *psVar6;
  size_type __n;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  double local_90;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  vVar1 = (this->primitive_).m_data.m_type;
  if (((((this->object_).
         super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr == (element_type *)0x0) &&
       ((this->array_).
        super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0)) && (vVar1 == null)) &&
     ((this->callable_).
      super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0)) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Undefined value or reference");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((byte)(vVar1 - number_integer) < 3) {
    if ((byte)((other->primitive_).m_data.m_type - number_integer) < 3) {
      local_90 = get<double>(this);
      dVar2 = get<double>(other);
      return local_90 < dVar2;
    }
LAB_001c3fc4:
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    dump_abi_cxx11_(&local_88,this,-1,false);
    std::operator+(&local_48,"Cannot compare values: ",&local_88);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
    local_d0._M_dataplus._M_p = (pointer)*plVar5;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar6) {
      local_d0.field_2._M_allocated_capacity = *psVar6;
      local_d0.field_2._8_8_ = plVar5[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar6;
    }
    local_d0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    dump_abi_cxx11_(&local_68,other,-1,false);
    std::operator+(&local_b0,&local_d0,&local_68);
    std::runtime_error::runtime_error(prVar4,(string *)&local_b0);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((vVar1 != string) || ((other->primitive_).m_data.m_type != string)) goto LAB_001c3fc4;
  get<std::__cxx11::string>(&local_b0,this);
  get<std::__cxx11::string>(&local_d0,other);
  __n = local_b0._M_string_length;
  if (local_d0._M_string_length < local_b0._M_string_length) {
    __n = local_d0._M_string_length;
  }
  if (__n != 0) {
    uVar3 = memcmp(local_b0._M_dataplus._M_p,local_d0._M_dataplus._M_p,__n);
    uVar7 = (ulong)uVar3;
    if (uVar3 != 0) goto LAB_001c3f48;
  }
  uVar7 = 0xffffffff80000000;
  if (-0x80000000 < (long)(local_b0._M_string_length - local_d0._M_string_length)) {
    uVar7 = local_b0._M_string_length - local_d0._M_string_length;
  }
  if (0x7ffffffe < (long)uVar7) {
    uVar7 = 0;
  }
LAB_001c3f48:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return (bool)((byte)(uVar7 >> 0x1f) & 1);
}

Assistant:

bool operator<(const Value & other) const {
    if (is_null())
      throw std::runtime_error("Undefined value or reference");
    if (is_number() && other.is_number()) return get<double>() < other.get<double>();
    if (is_string() && other.is_string()) return get<std::string>() < other.get<std::string>();
    throw std::runtime_error("Cannot compare values: " + dump() + " < " + other.dump());
  }